

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.h
# Opt level: O2

void __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
~MelGeneralizedCepstrumToMelGeneralizedCepstrum
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this)

{
  pointer ppMVar1;
  
  this->_vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum =
       (_func_int **)&PTR__MelGeneralizedCepstrumToMelGeneralizedCepstrum_0011e4d0;
  for (ppMVar1 = (this->modules_).
                 super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar1 !=
      (this->modules_).
      super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar1 = ppMVar1 + 1) {
    if (*ppMVar1 != (ModuleInterface *)0x0) {
      (*(*ppMVar1)->_vptr_ModuleInterface[1])();
    }
  }
  std::
  _Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
  ::~_Vector_base(&(this->modules_).
                   super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                 );
  return;
}

Assistant:

virtual ~MelGeneralizedCepstrumToMelGeneralizedCepstrum() {
    for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                         ModuleInterface*>::iterator itr(modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }